

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::Subtract
          (TPZMatrix<std::complex<long_double>_> *this,TPZMatrix<std::complex<long_double>_> *A,
          TPZMatrix<std::complex<long_double>_> *res)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  longdouble lVar6;
  longdouble lVar7;
  TPZFMatrixRef<std::complex<long_double>_> ref;
  longdouble local_188;
  longdouble local_178;
  TPZFMatrixRef<std::complex<long_double>_> local_168;
  TPZFMatrix<std::complex<long_double>_> local_c8;
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])();
  iVar2 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar3 = __dynamic_cast(res,&TPZMatrix<std::complex<long_double>>::typeinfo,
                           &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
    if (lVar3 != 0) {
      lVar3 = __dynamic_cast(A,&TPZMatrix<std::complex<long_double>>::typeinfo,
                             &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
      lVar4 = __dynamic_cast(this,&TPZMatrix<std::complex<long_double>>::typeinfo,
                             &TPZFMatrix<std::complex<long_double>>::typeinfo,0);
      if ((lVar4 == 0) || (lVar3 == 0)) {
        lVar3 = (this->super_TPZBaseMatrix).fRow;
        if (lVar3 < 1) {
          return;
        }
        lVar4 = (this->super_TPZBaseMatrix).fCol;
        lVar5 = 0;
        do {
          if (0 < lVar4) {
            lVar3 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_c8,this,lVar5,lVar3);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_188,A,lVar5,lVar3);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow._0_2_ =
                   (undefined2)
                   (undefined4)
                   local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow;
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow._2_2_ =
                   (undefined2)
                   ((uint)(undefined4)
                          local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
                          fRow >> 0x10);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow._4_4_ =
                   local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow.
                   _4_4_;
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_2_ =
                   local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_2_;
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._26_2_ =
                   local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._26_2_;
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._28_4_ =
                   local_c8.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._28_4_;
              lVar7 = (longdouble)
                      CONCAT28((undefined2)
                               local_168.super_TPZFMatrix<std::complex<long_double>_>.
                               super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow,
                               CONCAT44(local_c8.super_TPZMatrix<std::complex<long_double>_>.
                                        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._4_4_,
                                        local_c8.super_TPZMatrix<std::complex<long_double>_>.
                                        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_)
                              ) - local_188;
              lVar6 = (longdouble)
                      CONCAT28(local_168.super_TPZFMatrix<std::complex<long_double>_>.
                               super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
                               _24_2_,CONCAT44(local_c8.super_TPZMatrix<std::complex<long_double>_>.
                                               super_TPZBaseMatrix.fCol._4_4_,
                                               (undefined4)
                                               local_c8.super_TPZMatrix<std::complex<long_double>_>.
                                               super_TPZBaseMatrix.fCol)) - local_178;
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable._0_4_ = SUB104(lVar7,0);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable._4_4_ = (undefined4)((unkuint10)lVar7 >> 0x20);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow._0_2_ =
                   (undefined2)((unkuint10)lVar7 >> 0x40);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol._0_4_ =
                   SUB104(lVar6,0);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol._4_4_ =
                   (undefined4)((unkuint10)lVar6 >> 0x20);
              local_168.super_TPZFMatrix<std::complex<long_double>_>.
              super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_2_ =
                   SUB102((unkuint10)lVar6 >> 0x40,0);
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar5,lVar3,&local_168);
              lVar3 = lVar3 + 1;
              lVar4 = (this->super_TPZBaseMatrix).fCol;
            } while (lVar3 < lVar4);
            lVar3 = (this->super_TPZBaseMatrix).fRow;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar3);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    Storage(&local_c8,A);
    iVar1 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(res);
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    iVar2 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    TPZFMatrixRef<std::complex<long_double>_>::TPZFMatrixRef
              (&local_168,CONCAT44(extraout_var_01,iVar1),
               (complex<long_double> **)CONCAT44(extraout_var_02,iVar2));
    TPZFMatrix<std::complex<long_double>_>::operator-=
              (&local_168.super_TPZFMatrix<std::complex<long_double>_>,
               &local_c8.super_TPZMatrix<std::complex<long_double>_>);
    TPZFMatrixRef<std::complex<long_double>_>::~TPZFMatrixRef
              (&local_168,&TPZFMatrixRef<std::complex<long_double>>::VTT);
    TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_c8);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<std::complex<long double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = std::complex<long double>]"
             ,0x85);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}